

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O2

bool __thiscall draco::MeshEdgebreakerEncoder::InitializeEncoder(MeshEdgebreakerEncoder *this)

{
  EncoderOptions *pEVar1;
  MeshEdgebreakerEncoderImplInterface *pMVar2;
  Mesh *pMVar3;
  pointer paVar4;
  pointer paVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this_00;
  allocator<char> local_49;
  string local_48;
  
  pEVar1 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"standard_edgebreaker",&local_49);
  bVar6 = Options::GetBool(&pEVar1->feature_options_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pEVar1 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"predictive_edgebreaker",&local_49);
  bVar7 = Options::GetBool(&pEVar1->feature_options_,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pMVar2 = (this->impl_)._M_t.
           super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
           .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl =
       (MeshEdgebreakerEncoderImplInterface *)0x0;
  if (pMVar2 != (MeshEdgebreakerEncoderImplInterface *)0x0) {
    (*pMVar2->_vptr_MeshEdgebreakerEncoderImplInterface[1])();
  }
  pEVar1 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  pMVar3 = (this->super_MeshEncoder).mesh_;
  paVar4 = (pMVar3->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar5 = (pMVar3->faces_).vector_.
           super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"edgebreaker_method",&local_49);
  iVar8 = Options::GetInt((Options *)pEVar1,&local_48,-1);
  std::__cxx11::string::~string((string *)&local_48);
  if (iVar8 == 2) {
LAB_00131425:
    local_48._M_dataplus._M_p._0_1_ = 2;
    EncoderBuffer::Encode<unsigned_char>
              ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,(uchar *)&local_48);
    this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
              operator_new(0x2c8);
    MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
    MeshEdgebreakerEncoderImpl(this_00);
LAB_00131478:
    pMVar2 = (this->impl_)._M_t.
             super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>.
             _M_head_impl;
    (this->impl_)._M_t.
    super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    ._M_t.
    super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl =
         &this_00->super_MeshEdgebreakerEncoderImplInterface;
    if (pMVar2 == (MeshEdgebreakerEncoderImplInterface *)0x0) goto LAB_0013149d;
    (*pMVar2->_vptr_MeshEdgebreakerEncoderImplInterface[1])();
  }
  else if (iVar8 == 0) {
    if (bVar6) {
LAB_00131452:
      local_48._M_dataplus._M_p._0_1_ = 0;
      EncoderBuffer::Encode<unsigned_char>
                ((this->super_MeshEncoder).super_PointCloudEncoder.buffer_,(uchar *)&local_48);
      this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
                operator_new(0x260);
      MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::MeshEdgebreakerEncoderImpl
                ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)this_00);
      goto LAB_00131478;
    }
  }
  else if (iVar8 == -1) {
    if ((bVar6) &&
       (((iVar8 = EncoderOptionsBase<int>::GetSpeed
                            ((this->super_MeshEncoder).super_PointCloudEncoder.options_),
         (uint)(((long)paVar4 - (long)paVar5) / 0xc) < 1000 || (4 < iVar8)) || (!bVar7))))
    goto LAB_00131452;
    goto LAB_00131425;
  }
  this_00 = (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
            (this->impl_)._M_t.
            super___uniq_ptr_impl<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
            .super__Head_base<0UL,_draco::MeshEdgebreakerEncoderImplInterface_*,_false>._M_head_impl
  ;
  if (this_00 == (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)0x0) {
    return false;
  }
LAB_0013149d:
  iVar8 = (*(this_00->super_MeshEdgebreakerEncoderImplInterface).
            _vptr_MeshEdgebreakerEncoderImplInterface[2])(this_00,this);
  return (bool)(char)iVar8;
}

Assistant:

bool MeshEdgebreakerEncoder::InitializeEncoder() {
  const bool is_standard_edgebreaker_available =
      options()->IsFeatureSupported(features::kEdgebreaker);
  const bool is_predictive_edgebreaker_available =
      options()->IsFeatureSupported(features::kPredictiveEdgebreaker);

  impl_ = nullptr;
  // For tiny meshes it's usually better to use the basic edgebreaker as the
  // overhead of the predictive one may turn out to be too big.
  const bool is_tiny_mesh = mesh()->num_faces() < 1000;

  int selected_edgebreaker_method =
      options()->GetGlobalInt("edgebreaker_method", -1);
  if (selected_edgebreaker_method == -1) {
    if (is_standard_edgebreaker_available &&
        (options()->GetSpeed() >= 5 || !is_predictive_edgebreaker_available ||
         is_tiny_mesh)) {
      selected_edgebreaker_method = MESH_EDGEBREAKER_STANDARD_ENCODING;
    } else {
      selected_edgebreaker_method = MESH_EDGEBREAKER_VALENCE_ENCODING;
    }
  }

  if (selected_edgebreaker_method == MESH_EDGEBREAKER_STANDARD_ENCODING) {
    if (is_standard_edgebreaker_available) {
      buffer()->Encode(
          static_cast<uint8_t>(MESH_EDGEBREAKER_STANDARD_ENCODING));
      impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
          new MeshEdgebreakerEncoderImpl<MeshEdgebreakerTraversalEncoder>());
    }
  } else if (selected_edgebreaker_method == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    buffer()->Encode(static_cast<uint8_t>(MESH_EDGEBREAKER_VALENCE_ENCODING));
    impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
        new MeshEdgebreakerEncoderImpl<
            MeshEdgebreakerTraversalValenceEncoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}